

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void ZopfliDeflatePart(ZopfliOptions *options,int btype,int final,uchar *in,size_t instart,
                      size_t inend,uchar *bp,uchar **out,size_t *outsize)

{
  long lVar1;
  unsigned_short *lend;
  bool bVar2;
  ZopfliOptions *pZVar3;
  uint symbol;
  size_t **ppsVar4;
  size_t sVar5;
  size_t sVar6;
  int btype_00;
  ulong uVar7;
  size_t **ppsVar8;
  ZopfliOptions *pZVar9;
  unsigned_short *lstart;
  bool bVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  size_t *in_stack_fffffffffffffa20;
  size_t *psVar14;
  double local_5d8;
  size_t npoints;
  int local_5b4;
  size_t **local_5b0;
  double local_5a8;
  size_t *splitpoints_uncompressed;
  double local_598;
  double dStack_590;
  ZopfliLZ77Store lz77;
  ZopfliBlockState s;
  ZopfliLZ77Store store;
  
  splitpoints_uncompressed = (size_t *)0x0;
  npoints = 0;
  local_5b4 = final;
  local_5a8 = (double)instart;
  local_598 = (double)inend;
  if (btype == 1) {
    ZopfliInitLZ77Store(in,&store);
    dVar12 = local_598;
    dVar11 = local_5a8;
    ZopfliInitBlockState(options,(size_t)local_5a8,(size_t)local_598,1,&s);
    psVar14 = (size_t *)0x12329e;
    ZopfliLZ77OptimalFixed(&s,in,(size_t)dVar11,(size_t)dVar12,&store);
    AddLZ77Block(options,1,local_5b4,&store,0,store.size,(size_t)bp,(uchar *)out,(uchar **)outsize,
                 psVar14);
    ZopfliCleanBlockState(&s);
    ZopfliCleanLZ77Store(&store);
  }
  else if (btype == 0) {
    AddNonCompressedBlock
              ((ZopfliOptions *)(ulong)(uint)final,(int)in,(uchar *)instart,inend,(size_t)bp,
               (uchar *)out,(uchar **)outsize,in_stack_fffffffffffffa20);
  }
  else {
    if (options->blocksplitting == 0) {
      local_5b0 = (size_t **)0x0;
    }
    else {
      ZopfliBlockSplit(options,in,instart,inend,(long)options->blocksplittingmax,
                       &splitpoints_uncompressed,&npoints);
      local_5b0 = (size_t **)malloc(npoints << 3);
    }
    ZopfliInitLZ77Store(in,&lz77);
    local_5d8 = 0.0;
    uVar7 = 0;
    do {
      dVar11 = local_5a8;
      if (uVar7 != 0) {
        dVar11 = (double)splitpoints_uncompressed[uVar7 - 1];
      }
      dVar12 = local_598;
      if (uVar7 != npoints) {
        dVar12 = (double)splitpoints_uncompressed[uVar7];
      }
      ZopfliInitLZ77Store(in,&store);
      ZopfliInitBlockState(options,(size_t)dVar11,(size_t)dVar12,1,&s);
      ZopfliLZ77Optimal(&s,in,(size_t)dVar11,(size_t)dVar12,options->numiterations,&store);
      dVar11 = ZopfliCalculateBlockSizeAutoType(&store,0,store.size);
      ZopfliAppendLZ77Store(&store,&lz77);
      if (uVar7 < npoints) {
        local_5b0[uVar7] = (size_t *)lz77.size;
      }
      local_5d8 = local_5d8 + dVar11;
      ZopfliCleanBlockState(&s);
      ZopfliCleanLZ77Store(&store);
      uVar7 = uVar7 + 1;
    } while (uVar7 <= npoints);
    if ((1 < npoints) && (options->blocksplitting != 0)) {
      pZVar9 = (ZopfliOptions *)0x0;
      store.litlens = (unsigned_short *)0x0;
      s.options = (ZopfliOptions *)0x0;
      ZopfliBlockSplitLZ77
                (options,&lz77,(long)options->blocksplittingmax,(size_t **)&store,(size_t *)&s);
      dVar11 = 0.0;
      do {
        if (pZVar9 == (ZopfliOptions *)0x0) {
          sVar5 = 0;
        }
        else {
          sVar5 = *(size_t *)(store.litlens + (long)pZVar9 * 4 + -4);
        }
        psVar14 = (size_t *)(store.litlens + (long)pZVar9 * 4);
        if (pZVar9 == s.options) {
          psVar14 = &lz77.size;
        }
        dVar12 = ZopfliCalculateBlockSizeAutoType(&lz77,sVar5,*psVar14);
        pZVar3 = s.options;
        dVar11 = dVar11 + dVar12;
        pZVar9 = (ZopfliOptions *)((long)&pZVar9->verbose + 1);
      } while (pZVar9 <= s.options);
      if (local_5d8 <= dVar11) {
        free(store.litlens);
      }
      else {
        free(local_5b0);
        local_5b0 = (size_t **)store.litlens;
        npoints = (size_t)pZVar3;
      }
    }
    uVar7 = 0;
    ppsVar8 = local_5b0;
    do {
      if (uVar7 == 0) {
        lstart = (unsigned_short *)0x0;
      }
      else {
        lstart = (unsigned_short *)ppsVar8[-1];
      }
      ppsVar4 = ppsVar8;
      if (uVar7 == npoints) {
        ppsVar4 = (size_t **)&lz77.size;
      }
      lend = (unsigned_short *)*ppsVar4;
      symbol = (uint)(uVar7 == npoints && local_5b4 != 0);
      sVar5 = ZopfliLZ77GetByteRange(&lz77,(size_t)lstart,(size_t)lend);
      lVar1 = sVar5 * 8 +
              ((ulong)(0x1000100010001 < sVar5 * -0x1000100010001) + sVar5 / 0xffff) * 0x28;
      auVar13._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar13._0_8_ = lVar1;
      auVar13._12_4_ = 0x45300000;
      local_598 = (double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0;
      dStack_590 = auVar13._8_8_ - 1.9342813113834067e+25;
      local_5d8 = ZopfliCalculateBlockSize(&lz77,(size_t)lstart,(size_t)lend,1);
      dVar11 = GetDynamicLengths(&lz77,(size_t)lstart,(size_t)lend,(uint *)&store,(uint *)&s);
      bVar10 = 999 < lz77.size;
      bVar2 = (dVar11 + 3.0) * 1.1 < local_5d8;
      if (lstart == lend) {
        AddBits(symbol,1,bp,out,outsize);
        AddBits(1,2,bp,out,outsize);
        AddBits(0,7,bp,out,outsize);
      }
      else {
        psVar14 = (size_t *)0x1236c4;
        local_5a8 = dVar11 + 3.0;
        ZopfliInitLZ77Store(lz77.data,&store);
        if (!bVar10 || !bVar2) {
          sVar5 = lz77.pos[(long)lstart];
          sVar6 = ZopfliLZ77GetByteRange(&lz77,(size_t)lstart,(size_t)lend);
          ZopfliInitBlockState(options,sVar5,sVar6 + sVar5,1,&s);
          ZopfliLZ77OptimalFixed(&s,lz77.data,sVar5,sVar6 + sVar5,&store);
          local_5d8 = ZopfliCalculateBlockSize(&store,0,store.size,1);
          psVar14 = (size_t *)0x123754;
          ZopfliCleanBlockState(&s);
        }
        if ((local_5d8 <= dStack_590 + local_598) || (local_5a8 <= dStack_590 + local_598)) {
          if (local_5a8 <= local_5d8) {
            btype_00 = 2;
            goto LAB_001237ff;
          }
          if (bVar10 && bVar2) {
            btype_00 = 1;
            goto LAB_001237ff;
          }
          AddLZ77Block(options,1,symbol,&store,0,store.size,(size_t)bp,(uchar *)out,
                       (uchar **)outsize,psVar14);
        }
        else {
          btype_00 = 0;
LAB_001237ff:
          AddLZ77Block(options,btype_00,symbol,&lz77,(size_t)lstart,(size_t)lend,(size_t)bp,
                       (uchar *)out,(uchar **)outsize,psVar14);
        }
        ZopfliCleanLZ77Store(&store);
      }
      uVar7 = uVar7 + 1;
      ppsVar8 = ppsVar8 + 1;
    } while (uVar7 <= npoints);
    ZopfliCleanLZ77Store(&lz77);
    free(local_5b0);
    free(splitpoints_uncompressed);
  }
  return;
}

Assistant:

void ZopfliDeflatePart(const ZopfliOptions* options, int btype, int final,
                       const unsigned char* in, size_t instart, size_t inend,
                       unsigned char* bp, unsigned char** out,
                       size_t* outsize) {
  size_t i;
  /* byte coordinates rather than lz77 index */
  size_t* splitpoints_uncompressed = 0;
  size_t npoints = 0;
  size_t* splitpoints = 0;
  double totalcost = 0;
  ZopfliLZ77Store lz77;

  /* If btype=2 is specified, it tries all block types. If a lesser btype is
  given, then however it forces that one. Neither of the lesser types needs
  block splitting as they have no dynamic huffman trees. */
  if (btype == 0) {
    AddNonCompressedBlock(options, final, in, instart, inend, bp, out, outsize);
    return;
  } else if (btype == 1) {
    ZopfliLZ77Store store;
    ZopfliBlockState s;
    ZopfliInitLZ77Store(in, &store);
    ZopfliInitBlockState(options, instart, inend, 1, &s);

    ZopfliLZ77OptimalFixed(&s, in, instart, inend, &store);
    AddLZ77Block(options, btype, final, &store, 0, store.size, 0,
                 bp, out, outsize);

    ZopfliCleanBlockState(&s);
    ZopfliCleanLZ77Store(&store);
    return;
  }


  if (options->blocksplitting) {
    ZopfliBlockSplit(options, in, instart, inend,
                     options->blocksplittingmax,
                     &splitpoints_uncompressed, &npoints);
    splitpoints = (size_t*)malloc(sizeof(*splitpoints) * npoints);
  }

  ZopfliInitLZ77Store(in, &lz77);

  for (i = 0; i <= npoints; i++) {
    size_t start = i == 0 ? instart : splitpoints_uncompressed[i - 1];
    size_t end = i == npoints ? inend : splitpoints_uncompressed[i];
    ZopfliBlockState s;
    ZopfliLZ77Store store;
    ZopfliInitLZ77Store(in, &store);
    ZopfliInitBlockState(options, start, end, 1, &s);
    ZopfliLZ77Optimal(&s, in, start, end, options->numiterations, &store);
    totalcost += ZopfliCalculateBlockSizeAutoType(&store, 0, store.size);

    ZopfliAppendLZ77Store(&store, &lz77);
    if (i < npoints) splitpoints[i] = lz77.size;

    ZopfliCleanBlockState(&s);
    ZopfliCleanLZ77Store(&store);
  }

  /* Second block splitting attempt */
  if (options->blocksplitting && npoints > 1) {
    size_t* splitpoints2 = 0;
    size_t npoints2 = 0;
    double totalcost2 = 0;

    ZopfliBlockSplitLZ77(options, &lz77,
                         options->blocksplittingmax, &splitpoints2, &npoints2);

    for (i = 0; i <= npoints2; i++) {
      size_t start = i == 0 ? 0 : splitpoints2[i - 1];
      size_t end = i == npoints2 ? lz77.size : splitpoints2[i];
      totalcost2 += ZopfliCalculateBlockSizeAutoType(&lz77, start, end);
    }

    if (totalcost2 < totalcost) {
      free(splitpoints);
      splitpoints = splitpoints2;
      npoints = npoints2;
    } else {
      free(splitpoints2);
    }
  }

  for (i = 0; i <= npoints; i++) {
    size_t start = i == 0 ? 0 : splitpoints[i - 1];
    size_t end = i == npoints ? lz77.size : splitpoints[i];
    AddLZ77BlockAutoType(options, i == npoints && final,
                         &lz77, start, end, 0,
                         bp, out, outsize);
  }

  ZopfliCleanLZ77Store(&lz77);
  free(splitpoints);
  free(splitpoints_uncompressed);
}